

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

void __thiscall
ON_ClassArray<ON_SubDEdgePtr>::Append(ON_ClassArray<ON_SubDEdgePtr> *this,ON_SubDEdgePtr *x)

{
  uint uVar1;
  uint uVar2;
  ON__UINT_PTR OVar3;
  uint uVar4;
  int iVar5;
  
  uVar1 = this->m_count;
  uVar2 = this->m_capacity;
  if (uVar1 != uVar2) {
LAB_0061d091:
    iVar5 = this->m_count;
    this->m_count = iVar5 + 1;
    this->m_a[iVar5].m_ptr = x->m_ptr;
    return;
  }
  if ((int)uVar1 < 8 || (ulong)((long)(int)uVar1 * 8) < 0x10000001) {
    uVar4 = 4;
    if (2 < (int)uVar1) {
      uVar4 = uVar1 * 2;
    }
  }
  else {
    uVar4 = 0x2000008;
    if ((int)uVar1 < 0x2000008) {
      uVar4 = uVar1;
    }
    uVar4 = uVar4 + uVar1;
  }
  if ((this->m_a == (ON_SubDEdgePtr *)0x0) ||
     (iVar5 = (int)((ulong)((long)x - (long)this->m_a) >> 3), (int)uVar2 <= iVar5 || iVar5 < 0)) {
    if (uVar2 < uVar4) {
      SetCapacity(this,(long)(int)uVar4);
    }
    if (this->m_a != (ON_SubDEdgePtr *)0x0) goto LAB_0061d091;
    iVar5 = 0x6c6;
  }
  else {
    OVar3 = x->m_ptr;
    if (uVar2 < uVar4) {
      SetCapacity(this,(long)(int)uVar4);
    }
    if (this->m_a != (ON_SubDEdgePtr *)0x0) {
      iVar5 = this->m_count;
      this->m_count = iVar5 + 1;
      this->m_a[iVar5].m_ptr = OVar3;
      return;
    }
    iVar5 = 0x6bc;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
             ,iVar5,"","allocation failure");
  return;
}

Assistant:

void ON_ClassArray<T>::Append( const T& x ) 
{
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if (m_a)
    {
      const int s = (int)(&x - m_a); // (int) cast is for 64 bit pointers
      if ( s >= 0 && s < m_capacity )
      {
        // 26 Sep 2005 Dale Lear
        //    User passed in an element of the m_a[]
        //    that will get reallocated by the call
        //    to Reserve(newcapacity).
        T temp;   // ON_*Array<> templates do not require robust copy constructor.
        temp = x; // ON_*Array<> templates require a robust operator=.
        Reserve( newcapacity );
        if (nullptr == m_a)
        {
          ON_ERROR("allocation failure");
          return;
        }
        m_a[m_count++] = temp;
        return;
      }
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = x;
}